

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.cpp
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::DuplicateColumn::undoFix
          (DuplicateColumn *this,HighsOptions *options,HighsSolution *solution)

{
  double dVar1;
  double v;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pdVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  double dVar9;
  HighsCDouble HVar10;
  double local_148;
  double local_138;
  double local_130;
  HighsCDouble local_110;
  HighsCDouble local_100;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  undefined8 uStack_d0;
  HighsSolution *local_c0;
  HighsCDouble local_b8;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  long local_60;
  double local_58;
  HighsCDouble local_50;
  HighsCDouble local_40;
  
  local_e0 = (options->super_HighsOptionsStruct).mip_feasibility_tolerance;
  dVar8 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  iVar4 = this->col;
  dVar1 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4];
  v = this->colScale;
  local_138 = this->colLower;
  bVar2 = this->colIntegral;
  bVar3 = this->duplicateColIntegral;
  local_60 = (long)this->duplicateCol;
  if (bVar2 == true) {
    local_138 = ceil(local_138 - local_e0);
    local_d8 = floor(this->colUpper + local_e0);
    uStack_d0 = extraout_XMM0_Qb;
    if (bVar3 != false) goto LAB_002f347e;
    local_130 = this->duplicateColLower;
    local_e8 = this->duplicateColUpper;
  }
  else {
    local_d8 = this->colUpper;
    uStack_d0 = 0;
    if (bVar3 == false) {
      local_130 = this->duplicateColLower;
      local_e8 = this->duplicateColUpper;
      if (-INFINITY < local_130) {
        local_100.lo = 0.0;
        local_100.hi = dVar1;
        local_b8.lo = 0.0;
        local_b8.hi = local_130;
        local_110 = HighsCDouble::operator*(&local_b8,v);
        HVar10 = HighsCDouble::operator-(&local_100,&local_110);
        dVar9 = HVar10.lo + HVar10.hi;
      }
      else {
        dVar9 = *(double *)(&DAT_003990f0 + (ulong)(0.0 < v) * 8);
      }
      if (local_e8 < INFINITY) {
        local_100.lo = 0.0;
        local_100.hi = dVar1;
        local_b8.lo = 0.0;
        local_b8.hi = local_e8;
        local_110 = HighsCDouble::operator*(&local_b8,v);
        HVar10 = HighsCDouble::operator-(&local_100,&local_110);
        dVar7 = HVar10.lo + HVar10.hi;
      }
      else {
        dVar7 = *(double *)(&DAT_003a2870 + (ulong)(0.0 < v) * 8);
      }
      local_40.hi = local_130;
      if (0.0 < v) {
        if (local_e8 == INFINITY) {
          if (local_130 == -INFINITY) goto LAB_002f3ecd;
          local_148 = dVar8 + local_d8;
          if (dVar9 <= local_148) goto LAB_002f3b6b;
          local_110.lo = 0.0;
          local_110.hi = dVar1;
          local_100 = HighsCDouble::operator-(&local_110,local_d8);
          HVar10 = HighsCDouble::operator/(&local_100,v);
          local_40.hi = HVar10.lo + HVar10.hi;
          dVar9 = local_d8;
          if (local_40.hi <= dVar8 + local_e8) goto LAB_002f3b6b;
        }
        else {
          local_148 = local_138 - dVar8;
          dVar9 = dVar7;
          local_40.hi = local_e8;
          if (local_148 <= dVar7) goto LAB_002f3b6b;
          local_110.lo = 0.0;
          local_110.hi = dVar1;
          local_100 = HighsCDouble::operator-(&local_110,local_138);
          HVar10 = HighsCDouble::operator/(&local_100,v);
          local_40.hi = HVar10.lo + HVar10.hi;
          dVar9 = local_138;
          if (local_130 - dVar8 <= local_40.hi) goto LAB_002f3b6b;
        }
      }
      else if (local_130 == -INFINITY) {
        if (local_e8 == INFINITY) {
LAB_002f3ecd:
          dVar9 = local_138;
          if (local_138 <= 0.0) {
            dVar9 = 0.0;
          }
          local_110.lo = 0.0;
          local_110.hi = dVar1;
          local_100 = HighsCDouble::operator-(&local_110,dVar9);
          HVar10 = HighsCDouble::operator/(&local_100,v);
          local_40.hi = HVar10.lo + HVar10.hi;
          goto LAB_002f3b6b;
        }
        local_148 = dVar8 + local_d8;
        dVar9 = dVar7;
        local_40.hi = local_e8;
        if (dVar7 <= local_148) goto LAB_002f3b6b;
        local_110.lo = 0.0;
        local_110.hi = dVar1;
        local_100 = HighsCDouble::operator-(&local_110,local_d8);
        HVar10 = HighsCDouble::operator/(&local_100,v);
        local_40.hi = HVar10.lo + HVar10.hi;
        dVar9 = local_d8;
        if (local_130 - dVar8 <= local_40.hi) goto LAB_002f3b6b;
      }
      else {
        local_148 = local_138 - dVar8;
        if (local_148 <= dVar9) goto LAB_002f3b6b;
        local_110.lo = 0.0;
        local_110.hi = dVar1;
        local_100 = HighsCDouble::operator-(&local_110,local_138);
        HVar10 = HighsCDouble::operator/(&local_100,v);
        local_40.hi = HVar10.lo + HVar10.hi;
        dVar9 = local_138;
        if (local_40.hi <= dVar8 + local_e8) goto LAB_002f3b6b;
      }
      local_110.lo = 0.0;
      local_110.hi = dVar1;
      local_100 = HighsCDouble::operator-(&local_110,local_148);
      HVar10 = HighsCDouble::operator/(&local_100,v);
      local_40.hi = HVar10.lo + HVar10.hi;
      dVar9 = local_148;
      goto LAB_002f3b6b;
    }
LAB_002f347e:
    local_130 = ceil(this->duplicateColLower - local_e0);
    local_e8 = floor(this->duplicateColUpper + local_e0);
    if (bVar2 == false) {
      if (-INFINITY < local_130) {
        local_78 = 1.0;
        local_f0 = local_130;
        dVar9 = local_e8;
        uStack_90 = extraout_XMM0_Qb_00;
      }
      else {
        local_f0 = 0.0;
        if (INFINITY > local_e8) {
          local_f0 = local_e8;
        }
        local_78 = *(double *)(&DAT_003990c0 + (ulong)(INFINITY <= local_e8) * 8);
        uStack_90 = 0;
        dVar9 = -1000.0;
      }
      local_98 = (double)(~-(ulong)(INFINITY <= local_e8) & (ulong)dVar9 |
                         -(ulong)(INFINITY <= local_e8) & 0x408f400000000000);
      local_a8 = dVar8 + local_d8;
      local_88 = local_98 + 1e-08;
      uStack_80 = 0;
      local_98 = local_98 + -1e-08;
      uStack_70 = 0;
      local_c0 = solution;
      do {
        local_100.lo = 0.0;
        local_100.hi = dVar1;
        local_b8.lo = 0.0;
        local_b8.hi = local_f0;
        local_110 = HighsCDouble::operator*(&local_b8,v);
        HVar10 = HighsCDouble::operator-(&local_100,&local_110);
        dVar9 = HVar10.lo + HVar10.hi;
        solution = local_c0;
        local_40.hi = local_f0;
        if (((local_138 - dVar8 <= dVar9) && (dVar9 <= local_a8)) ||
           (local_f0 = local_78 + local_f0, local_88 <= local_f0 && 0.0 < local_78)) break;
      } while (local_98 < local_f0 || 0.0 <= local_78);
      goto LAB_002f3b6b;
    }
  }
  if (-INFINITY < local_138) {
    local_a8 = (double)(~-(ulong)(INFINITY <= local_d8) & (ulong)local_d8 |
                       -(ulong)(INFINITY <= local_d8) & 0x408f400000000000);
    local_88 = 1.0;
    dVar7 = local_138;
    uStack_a0 = uStack_d0;
  }
  else {
    dVar7 = 0.0;
    if (INFINITY > local_d8) {
      dVar7 = local_d8;
    }
    lVar6 = (ulong)(INFINITY <= local_d8) * 8;
    local_88 = *(double *)(&DAT_003990c0 + lVar6);
    local_a8 = *(double *)(&DAT_003ab820 + lVar6);
    uStack_a0 = 0;
  }
  local_78 = local_130 - dVar8;
  local_58 = dVar8 + local_e8;
  local_98 = local_a8 + 1e-08;
  uStack_90 = 0;
  local_a8 = local_a8 + -1e-08;
  uStack_80 = 0;
  while( true ) {
    dVar9 = dVar7;
    local_110.lo = 0.0;
    local_110.hi = dVar1;
    local_100 = HighsCDouble::operator-(&local_110,dVar9);
    HVar10 = HighsCDouble::operator/(&local_100,v);
    local_40.hi = HVar10.lo + HVar10.hi;
    if (((local_78 <= local_40.hi) && (local_40.hi <= local_58)) &&
       ((bVar3 == false ||
        (local_f0 = local_40.hi, dVar7 = round(local_40.hi), local_40.hi = local_f0,
        ABS(local_f0 - dVar7) <= local_e0)))) break;
    dVar7 = local_88 + dVar9;
    if ((local_98 <= dVar7 && 0.0 < local_88) || (dVar7 <= local_a8 && local_88 < 0.0)) break;
  }
LAB_002f3b6b:
  local_110.lo = 0.0;
  local_110.hi = dVar9;
  local_40.lo = 0.0;
  local_f0 = local_40.hi;
  local_b8 = HighsCDouble::operator*(&local_40,v);
  local_100 = HighsCDouble::operator+(&local_110,&local_b8);
  local_50.lo = 0.0;
  local_50.hi = dVar1;
  HVar10 = HighsCDouble::operator-(&local_100,&local_50);
  if ((local_138 - dVar8 <= dVar9) &&
     ((((dVar9 <= local_d8 + dVar8 && (local_130 - dVar8 <= local_f0)) &&
       (local_f0 <= dVar8 + local_e8)) &&
      ((bVar2 == false || (dVar8 = round(dVar9), ABS(dVar9 - dVar8) <= local_e0)))))) {
    if (bVar3 == false) {
      if (0x7fefffffffffffff < (ulong)ABS(dVar9)) {
        return;
      }
    }
    else {
      dVar8 = round(local_f0);
      if (0x7fefffffffffffff < (ulong)ABS(dVar9)) {
        return;
      }
      if (local_e0 < ABS(local_f0 - dVar8)) {
        return;
      }
    }
    if (((ulong)ABS(local_f0) < 0x7ff0000000000000) && (ABS(HVar10.hi + HVar10.lo) <= 1e-12)) {
      pdVar5 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5[iVar4] = dVar9;
      pdVar5[local_60] = local_f0;
    }
  }
  return;
}

Assistant:

void HighsPostsolveStack::DuplicateColumn::undoFix(
    const HighsOptions& options, HighsSolution& solution) const {
  const double mip_feasibility_tolerance = options.mip_feasibility_tolerance;
  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  std::vector<double>& col_value = solution.col_value;
  const bool allow_assert = false;
  const bool debug_report = false;
  //=============================================================================================

  auto isInteger = [&](const double v) {
    return (fractionality(v) <= mip_feasibility_tolerance);
  };

  auto isFeasible = [&](const double l, const double v, const double u) {
    return v >= l - primal_feasibility_tolerance &&
           v <= u + primal_feasibility_tolerance;
  };
  const double merge_value = col_value[col];
  const double value_max = 1000;
  const double eps = 1e-8;
  const double scale = colScale;
  const bool x_int = colIntegral;
  const bool y_int = duplicateColIntegral;
  const int x_ix = col;
  const int y_ix = duplicateCol;
  const double x_lo =
      x_int ? std::ceil(colLower - mip_feasibility_tolerance) : colLower;
  const double x_up =
      x_int ? std::floor(colUpper + mip_feasibility_tolerance) : colUpper;
  const double y_lo =
      y_int ? std::ceil(duplicateColLower - mip_feasibility_tolerance)
            : duplicateColLower;
  const double y_up =
      y_int ? std::floor(duplicateColUpper + mip_feasibility_tolerance)
            : duplicateColUpper;
  if (kAllowDeveloperAssert) assert(scale);
  double x_v = merge_value;
  double y_v;

  //  assert(x_int);
  //  assert(y_int);
  //  assert(scale < 0);
  if (x_int) {
    double x_0 = 0;
    double x_d = 0;
    double x_1 = 0;
    double x_free = false;
    if (x_lo <= -kHighsInf) {
      if (x_up >= kHighsInf) {
        // x is free
        x_free = true;
        x_0 = 0;
        x_d = 1.0;
        x_1 = value_max;
      } else {
        // x is (-int, u]
        x_0 = x_up;
        x_d = -1.0;
        x_1 = -value_max;
      }
    } else {
      if (x_up >= kHighsInf) {
        // x is [l, inf)
        x_0 = x_lo;
        x_d = 1.0;
        x_1 = value_max;
      } else {
        // x is [l, u]
        x_0 = x_lo;
        x_d = 1.0;
        x_1 = x_up;
      }
    }
    // x is integer, so look through its possible values to find a
    // suitable y
    if (x_free && debug_report) printf("DuplicateColumn::undo x is free\n");
    if (debug_report)
      printf("DuplicateColumn::undo Using x (%g; %g; %g)\n", x_0, x_d, x_1);
    bool found_y = false;
    for (x_v = x_0;; x_v += x_d) {
      //      printf("x_v = %g\n", x_v);
      y_v = double((HighsCDouble(merge_value) - x_v) / scale);
      if (isFeasible(y_lo, y_v, y_up)) {
        found_y = !y_int || isInteger(y_v);
        if (found_y) break;
      }
      if (x_d > 0 && x_v + x_d >= x_1 + eps) break;
      if (x_d < 0 && x_v + x_d <= x_1 - eps) break;
    }
    if (allow_assert) assert(found_y);
  } else if (y_int) {
    double y_0 = 0;
    double y_d = 0;
    double y_1 = 0;
    double y_free = false;
    if (y_lo <= -kHighsInf) {
      if (y_up >= kHighsInf) {
        // y is free
        y_free = true;
        y_0 = 0;
        y_d = 1.0;
        y_1 = value_max;
      } else {
        // y is (-int, u]
        y_0 = y_up;
        y_d = -1.0;
        y_1 = -value_max;
      }
    } else {
      if (y_up >= kHighsInf) {
        // y is [l, inf)
        y_0 = y_lo;
        y_d = 1.0;
        y_1 = value_max;
      } else {
        // y is [l, u]
        y_0 = y_lo;
        y_d = 1.0;
        y_1 = y_up;
      }
    }
    // y is integer, so look through its possible values to find a
    // suitable x
    if (y_free && debug_report) printf("DuplicateColumn::undo y is free\n");
    if (debug_report)
      printf("DuplicateColumn::undo Using y (%g; %g; %g)\n", y_0, y_d, y_1);
    bool found_x = false;
    for (y_v = y_0;; y_v += y_d) {
      //      printf("y_v = %g\n", y_v);
      x_v = double((HighsCDouble(merge_value) - HighsCDouble(y_v) * scale));
      if (isFeasible(x_lo, x_v, x_up)) {
        found_x = !x_int || isInteger(x_v);
        if (found_x) break;
      }
      if (y_d > 0 && y_v + y_d >= y_1 + eps) break;
      if (y_d < 0 && y_v + y_d <= y_1 - eps) break;
    }
    if (allow_assert) assert(found_x);
  } else {
    // x and y are both continuous
    double v_m_a_ylo = 0;
    double v_m_a_yup = 0;
    if (y_lo <= -kHighsInf) {
      v_m_a_ylo = scale > 0 ? kHighsInf : -kHighsInf;
    } else {
      v_m_a_ylo =
          double((HighsCDouble(merge_value) - HighsCDouble(y_lo) * scale));
    }
    if (y_up >= kHighsInf) {
      v_m_a_yup = scale > 0 ? -kHighsInf : kHighsInf;
    } else {
      v_m_a_yup =
          double((HighsCDouble(merge_value) - HighsCDouble(y_up) * scale));
    }
    // Need to ensure that y puts x in [x_l, x_u]
    if (scale > 0) {
      if (debug_report)
        printf("DuplicateColumn::undo [V-a(y_u), V-a(y_l)] == [%g, %g]\n",
               v_m_a_yup, v_m_a_ylo);
      // V-ay is in [V-a(y_u), V-a(y_l)] == [v_m_a_yup, v_m_a_ylo]
      if (y_up < kHighsInf) {
        // If v_m_a_yup is right of x_up+eps then [v_m_a_yup, v_m_a_ylo] is
        // right of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_ylo computed from y_lo-eps.]
        if (kAllowDeveloperAssert)
          assert(x_up + primal_feasibility_tolerance >= v_m_a_yup);
        // This assignment is OK unless x_v < x_lo-eps
        y_v = y_up;
        x_v = v_m_a_yup;
        if (x_v < x_lo - primal_feasibility_tolerance) {
          // Try y_v corresponding to x_lo
          x_v = x_lo;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v < y_lo - primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            x_v = x_lo - primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else if (y_lo > -kHighsInf) {
        // If v_m_a_ylo is left of x_lo-eps then [v_m_a_yup, v_m_a_ylo] is
        // left of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_yup computed from y_up+eps.]
        if (kAllowDeveloperAssert)
          assert(x_lo - primal_feasibility_tolerance <= v_m_a_ylo);
        // This assignment is OK unless x_v > x_up-eps
        y_v = y_lo;
        x_v = v_m_a_ylo;
        if (x_v > x_up + primal_feasibility_tolerance) {
          // Try y_v corresponding to x_up
          //	  if (kAllowDeveloperAssert) assert(1==102);
          x_v = x_up;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v > y_up + primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            if (debug_report) printf("DuplicateColumn::undoFix 2==102\n");
            if (kAllowDeveloperAssert) assert(2 == 102);
            x_v = x_up + primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else {
        // y is free, so use x_v = max(0, x_lo)
        x_v = std::max(0.0, x_lo);
        y_v = double((HighsCDouble(merge_value) - x_v) / scale);
      }
    } else {  // scale < 0
      if (debug_report)
        printf("DuplicateColumn::undo [V-a(y_l), V-a(y_u)] == [%g, %g]\n",
               v_m_a_ylo, v_m_a_yup);
      // V-ay is in [V-a(y_l), V-a(y_u)] == [v_m_a_ylo, v_m_a_yup]
      //
      if (y_lo > -kHighsInf) {
        // If v_m_a_ylo is right of x_up+eps then [v_m_a_ylo, v_m_a_yup] is
        // right of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_ylo computed from y_up+eps.]
        if (kAllowDeveloperAssert)
          assert(x_up + primal_feasibility_tolerance >= v_m_a_ylo);
        // This assignment is OK unless x_v < x_lo-eps
        y_v = y_lo;
        x_v = v_m_a_ylo;
        if (x_v < x_lo - primal_feasibility_tolerance) {
          // Try y_v corresponding to x_lo
          //	  if (kAllowDeveloperAssert) assert(11==101);
          x_v = x_lo;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v > y_up + primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            if (debug_report) printf("DuplicateColumn::undoFix 12==101\n");
            if (kAllowDeveloperAssert) assert(12 == 101);
            x_v = x_lo - primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else if (y_up < kHighsInf) {
        // If v_m_a_yup is left of x_lo-eps then [v_m_a_ylo, v_m_a_yup] is
        // left of [x_lo-eps, x_up+eps] so there's no solution. [Could
        // try v_m_a_yup computed from y_lo-eps.]
        if (kAllowDeveloperAssert)
          assert(x_lo - primal_feasibility_tolerance <= v_m_a_yup);
        // This assignment is OK unless x_v < x_lo-eps
        y_v = y_up;
        x_v = v_m_a_yup;
        if (x_v > x_up + primal_feasibility_tolerance) {
          // Try y_v corresponding to x_up
          //	  if (kAllowDeveloperAssert) assert(11==102);
          x_v = x_up;
          y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          if (y_v < y_lo - primal_feasibility_tolerance) {
            // Very tight: use x_v on its margin and hope!
            if (debug_report) printf("DuplicateColumn::undoFix 12==102\n");
            if (kAllowDeveloperAssert) assert(12 == 102);
            x_v = x_up + primal_feasibility_tolerance;
            y_v = double((HighsCDouble(merge_value) - x_v) / scale);
          }
        }
      } else {
        // y is free, so use x_v = max(0, x_lo)
        x_v = std::max(0.0, x_lo);
        y_v = double((HighsCDouble(merge_value) - x_v) / scale);
      }
    }
  }
  const double residual_tolerance = 1e-12;
  double residual =
      std::fabs(double(HighsCDouble(x_v) + HighsCDouble(y_v) * scale -
                       HighsCDouble(merge_value)));
  const bool x_y_ok =
      isFeasible(x_lo, x_v, x_up) && isFeasible(y_lo, y_v, y_up) &&
      (!x_int || isInteger(x_v)) && (!y_int || isInteger(y_v)) &&
      (std::fabs(x_v) < kHighsInf) && (std::fabs(y_v) < kHighsInf) &&
      (residual <= residual_tolerance);

  bool check;
  check = isFeasible(x_lo, x_v, x_up);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: isFeasible(x_lo, x_v, x_up) is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = isFeasible(y_lo, y_v, y_up);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: isFeasible(y_lo, y_v, y_up) is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = !x_int || isInteger(x_v);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: !x_int || isInteger(x_v) is false\n");
    if (allow_assert) assert(check);
  }
  check = !y_int || isInteger(y_v);
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: !y_int || isInteger(y_v) is false\n");
    if (allow_assert) assert(check);
  }
  check = std::fabs(x_v) < kHighsInf;
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: std::fabs(x_v) < kHighsInf is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = std::fabs(y_v) < kHighsInf;
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: std::fabs(y_v) < kHighsInf is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = residual <= residual_tolerance;
  if (!check) {
    if (debug_report)
      printf(
          "DuplicateColumn::undo error: residual <= residual_tolerance is "
          "false\n");
    if (allow_assert) assert(check);
  }
  check = residual <= residual_tolerance;
  if (debug_report)
    printf("DuplicateColumn::undo%s x = %g; y = %g to give x + (%g)y = %g",
           x_y_ok ? "" : " ERROR", x_v, y_v, scale, merge_value);
  if (x_y_ok) {
    if (debug_report) printf(": FIXED\n");
  } else if (check) {
    if (debug_report) printf("\n");
  } else {
    if (debug_report) printf(": residual = %g\n", residual);
  }
  //=============================================================================================
  if (x_y_ok) {
    col_value[x_ix] = x_v;
    col_value[y_ix] = y_v;
  }
}